

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void EMIT_COMMENT(CodeGenGenericContext *ctx,char *text)

{
  x86Instruction *pxVar1;
  
  pxVar1 = ctx->x86Op;
  pxVar1->name = o_other;
  (pxVar1->field_4).comment = text;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_COMMENT(CodeGenGenericContext &ctx, const char* text)
{
#if !defined(NDEBUG)
	ctx.x86Op->name = o_other;
	ctx.x86Op->comment = text;
	ctx.x86Op++;
#else
	(void)ctx;
	(void)text;
#endif
}